

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

string * __thiscall cppcms::session_interface::get(session_interface *this,string *key)

{
  bool bVar1;
  iterator __lhs;
  string *error;
  pointer ppVar2;
  string *in_RDI;
  const_iterator p;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
  *in_stack_ffffffffffffff78;
  string *this_00;
  session_interface *in_stack_ffffffffffffffc0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>
  local_20 [4];
  
  this_00 = in_RDI;
  check(in_stack_ffffffffffffffc0);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x442764);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>
  ::_Rb_tree_const_iterator(local_20,&local_28);
  __lhs = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
          ::end(in_stack_ffffffffffffff78);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>
  ::_Rb_tree_const_iterator(&local_30,(iterator *)&stack0xffffffffffffffc8);
  bVar1 = std::operator==(local_20,&local_30);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>
                           *)this_00);
    std::__cxx11::string::string((string *)this_00,(string *)&ppVar2->second);
    return in_RDI;
  }
  error = (string *)__cxa_allocate_exception(0x30);
  std::operator+((char *)__lhs._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffc0);
  cppcms_error::cppcms_error((cppcms_error *)this_00,error);
  __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
}

Assistant:

std::string session_interface::get(std::string const &key)
{
	check();
	data_type::const_iterator p=data_.find(key);
	if(p==data_.end()) 
		throw cppcms_error("Undefined session key "+key);
	return p->second.value;
}